

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int read_Header(archive_read *a,_7z_header_info *h,int check_header_id)

{
  _7z_coders_info *val;
  uint64_t *puVar1;
  uchar uVar2;
  _7z_stream_info *si;
  size_t __nmemb;
  _7z_folder *p_Var3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  uchar *p;
  uchar *puVar7;
  byte *pbVar8;
  _7z_folder *p_Var9;
  _7z_coder *p_Var10;
  uint64_t uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar18;
  _7z_coder *p_Var19;
  uint64_t uVar20;
  uint uVar21;
  size_t b;
  size_t rbytes;
  bool bVar22;
  uint64_t size;
  ulong local_38;
  ulong uVar17;
  
  si = (_7z_stream_info *)a->format->data;
  if (check_header_id != 0) {
    puVar7 = header_bytes(a,1);
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar7 != '\x01') {
      return -1;
    }
  }
  pbVar8 = header_bytes(a,1);
  if (pbVar8 == (byte *)0x0) {
    return -1;
  }
  bVar5 = *pbVar8;
  if (bVar5 == 2) {
    puVar7 = header_bytes(a,1);
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    while (*puVar7 != '\0') {
      iVar6 = parse_7zip_uint64(a,&local_38);
      if (iVar6 < 0) {
        return -1;
      }
      puVar7 = header_bytes(a,1);
      if (puVar7 == (uchar *)0x0) {
        return -1;
      }
    }
    pbVar8 = header_bytes(a,1);
    if (pbVar8 == (byte *)0x0) {
      return -1;
    }
    bVar5 = *pbVar8;
  }
  if (bVar5 == 4) {
    iVar6 = read_StreamsInfo(a,si);
    if (iVar6 < 0) {
      return -1;
    }
    pbVar8 = header_bytes(a,1);
    if (pbVar8 == (byte *)0x0) {
      return -1;
    }
    bVar5 = *pbVar8;
  }
  if (bVar5 == 0) {
    return (uint)bVar5;
  }
  if (bVar5 == 5) {
    val = &si[1].ci;
    iVar6 = parse_7zip_uint64(a,&val->numFolders);
    if ((-1 < iVar6) && (val->numFolders < 0xf4241)) {
      p_Var9 = (_7z_folder *)calloc(val->numFolders,0x58);
      si[1].ci.folders = p_Var9;
      if ((p_Var9 != (_7z_folder *)0x0) && (pbVar8 = header_bytes(a,1), pbVar8 != (byte *)0x0)) {
        uVar16 = 0;
        do {
          bVar5 = *pbVar8;
          if (bVar5 == 0) {
            if (si[1].ci.numFolders == 0) {
              return 0;
            }
            p_Var3 = (si->ci).folders;
            uVar14 = 0;
            iVar6 = 0;
            iVar15 = 0;
            uVar16 = 0;
            uVar12 = 0;
            goto LAB_00160a8d;
          }
          iVar6 = parse_7zip_uint64(a,&local_38);
          uVar12 = local_38;
          if (iVar6 < 0) {
            return -1;
          }
          if (si[1].pi.numPackStreams < local_38) {
            return -1;
          }
          switch(bVar5) {
          case 0xe:
            __nmemb = val->numFolders;
            puVar7 = (uchar *)calloc(__nmemb,1);
            h->emptyStreamBools = puVar7;
            if (puVar7 == (uchar *)0x0) {
              return -1;
            }
            iVar6 = read_Bools(a,puVar7,__nmemb);
            if (iVar6 < 0) {
              return -1;
            }
            if (val->numFolders == 0) {
              uVar16 = 0;
            }
            else {
              uVar12 = 0;
              uVar16 = 0;
              do {
                uVar16 = (uVar16 + 1) - (uint)(h->emptyStreamBools[uVar12] == '\0');
                uVar12 = uVar12 + 1;
              } while ((uVar12 & 0xffffffff) < val->numFolders);
            }
            break;
          case 0xf:
            if ((int)uVar16 < 1) goto switchD_00160747_default;
            puVar7 = (uchar *)calloc((ulong)uVar16,1);
            h->emptyFileBools = puVar7;
LAB_00160990:
            if (puVar7 == (uchar *)0x0) {
              return -1;
            }
            iVar6 = read_Bools(a,puVar7,(ulong)uVar16);
            goto LAB_001609a7;
          case 0x10:
            if (0 < (int)uVar16) {
              puVar7 = (uchar *)calloc((ulong)uVar16,1);
              h->antiBools = puVar7;
              goto LAB_00160990;
            }
          default:
switchD_00160747_default:
            puVar7 = header_bytes(a,local_38);
            if (puVar7 == (uchar *)0x0) {
              return -1;
            }
            break;
          case 0x11:
            puVar7 = header_bytes(a,1);
            if (puVar7 == (uchar *)0x0) {
              return -1;
            }
            uVar12 = uVar12 - 1;
            if ((uVar12 & 1) != 0) {
              return -1;
            }
            uVar20 = val->numFolders;
            if (uVar12 < uVar20 * 4) {
              return -1;
            }
            p_Var10 = (_7z_coder *)malloc(uVar12);
            si[1].ss.unpack_streams = (size_t)p_Var10;
            if (p_Var10 == (_7z_coder *)0x0) {
              return -1;
            }
            uVar14 = uVar12;
            if (uVar12 != 0) {
              do {
                rbytes = 0x10000;
                if (uVar14 < 0x10000) {
                  rbytes = uVar14;
                }
                puVar7 = header_bytes(a,rbytes);
                if (puVar7 == (uchar *)0x0) {
                  return -1;
                }
                memcpy(p_Var10,puVar7,rbytes);
                p_Var10 = (_7z_coder *)((long)&p_Var10->codec + rbytes);
                uVar14 = uVar14 - rbytes;
              } while (uVar14 != 0);
              uVar20 = si[1].ci.numFolders;
              p_Var10 = (_7z_coder *)si[1].ss.unpack_streams;
            }
            if (uVar20 != 0) {
              uVar14 = 0;
              do {
                (&p_Var9->coders)[uVar14 * 0xb] = p_Var10;
                if (uVar12 < 2) {
                  return -1;
                }
                uVar11 = 0;
                p_Var19 = p_Var10;
                while ((p_Var10 = (_7z_coder *)((long)&p_Var19->codec + 2),
                       (char)p_Var19->codec != '\0' ||
                       (*(undefined1 *)((long)&p_Var19->codec + 1) != '\0'))) {
                  uVar12 = uVar12 - 2;
                  uVar11 = uVar11 + 2;
                  p_Var19 = p_Var10;
                  if (uVar12 < 2) {
                    return -1;
                  }
                }
                (&p_Var9->numCoders)[uVar14 * 0xb] = uVar11;
                uVar12 = uVar12 - 2;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (uVar14 < uVar20);
            }
            break;
          case 0x12:
          case 0x13:
          case 0x14:
            iVar6 = read_Times(a,h,(uint)bVar5);
LAB_001609a7:
            if (iVar6 < 0) {
              return -1;
            }
            break;
          case 0x15:
            puVar7 = header_bytes(a,2);
            if (puVar7 == (uchar *)0x0) {
              return -1;
            }
            uVar2 = *puVar7;
            uVar20 = val->numFolders;
            puVar7 = (uchar *)calloc(uVar20,1);
            h->attrBools = puVar7;
            if (puVar7 == (uchar *)0x0) {
              return -1;
            }
            if (uVar2 == '\0') {
              iVar6 = read_Bools(a,puVar7,uVar20);
              if (iVar6 < 0) {
                return -1;
              }
              uVar20 = val->numFolders;
            }
            else {
              memset(puVar7,1,uVar20);
            }
            if (uVar20 != 0) {
              uVar12 = 0;
              uVar14 = 1;
              do {
                if (h->attrBools[uVar12] != '\0') {
                  puVar7 = header_bytes(a,4);
                  if (puVar7 == (uchar *)0x0) {
                    return -1;
                  }
                  *(undefined4 *)((long)&p_Var9->numUnpackStreams + uVar12 * 0x58 + 4) =
                       *(undefined4 *)puVar7;
                  uVar20 = val->numFolders;
                }
                bVar22 = uVar14 < uVar20;
                uVar12 = uVar14;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (bVar22);
            }
          }
          pbVar8 = header_bytes(a,1);
        } while (pbVar8 != (byte *)0x0);
      }
    }
  }
  return -1;
LAB_00160a8d:
  if ((h->emptyStreamBools == (uchar *)0x0) || (h->emptyStreamBools[uVar14] == '\0')) {
    uVar21 = *(uint *)(&p_Var9->bindPairs + uVar14 * 0xb) | 0x10;
    *(uint *)(&p_Var9->bindPairs + uVar14 * 0xb) = uVar21;
  }
  else {
    uVar21 = *(uint *)(&p_Var9->bindPairs + uVar14 * 0xb);
  }
  puVar1 = &p_Var9->numCoders + uVar14 * 0xb;
  uVar18 = *(uint *)((long)&p_Var9->numUnpackStreams + uVar14 * 0x58 + 4);
  uVar13 = uVar18 >> 0x10;
  *(uint *)(&p_Var9->numUnpackStreams + uVar14 * 0xb) = uVar13;
  if ((uVar21 & 0x10) == 0) {
    if (h->emptyFileBools == (uchar *)0x0) {
      if (0xffff < uVar18) {
        bVar22 = false;
        goto LAB_00160b5e;
      }
LAB_00160b53:
      *(undefined4 *)(puVar1 + 10) = 0x41ff;
LAB_00160b92:
      uVar4 = *puVar1;
      if ((1 < uVar4) &&
         ((p_Var10 = (_7z_coder *)puVar1[1], *(char *)((long)p_Var10 + (uVar4 - 2)) != '/' ||
          (*(char *)((long)p_Var10 + (uVar4 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var10->codec + uVar4) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar1[1])->codec + *puVar1 + 1) = 0;
        *puVar1 = *puVar1 + 2;
        uVar18 = *(uint *)((long)puVar1 + 0x54);
      }
    }
    else {
      uVar2 = h->emptyFileBools[iVar15];
      bVar22 = uVar2 != '\0';
      iVar15 = iVar15 + 1;
      if (uVar18 < 0x10000) {
        if (uVar2 == '\0') goto LAB_00160b53;
        *(undefined4 *)(puVar1 + 10) = 0x81b6;
      }
      else {
LAB_00160b5e:
        if (((uVar18 & 0xf0000000) != 0x40000000) && (!bVar22)) {
          uVar13 = uVar13 & 0xfff | 0x4000;
          *(uint *)(puVar1 + 10) = uVar13;
        }
        if ((uVar13 & 0xf000) == 0x4000) goto LAB_00160b92;
      }
    }
    *(undefined4 *)((long)puVar1 + 0x14) = 0xffffffff;
  }
  else {
    if ((si->ss).unpack_streams <= (ulong)(long)iVar6) {
      return -1;
    }
    if (uVar18 < 0x10000) {
      *(undefined4 *)(puVar1 + 10) = 0x81b6;
    }
    if ((si->ss).digestsDefined[iVar6] != '\0') {
      *(uint *)(puVar1 + 3) = uVar21 | 8;
    }
    *(int *)((long)puVar1 + 0x14) = iVar6;
    iVar6 = iVar6 + 1;
  }
  if ((uVar18 & 1) != 0) {
    *(byte *)(puVar1 + 10) = (byte)puVar1[10] & 0x6d;
  }
  if (((ulong)puVar1[3] & 0x10) == 0 && uVar16 == 0) {
    *(undefined4 *)(puVar1 + 2) = 0xffffffff;
    uVar16 = 0;
  }
  else {
    if (uVar16 == 0) {
      while( true ) {
        if ((si->ci).numFolders <= uVar12) {
          return -1;
        }
        if (p_Var3[uVar12].numUnpackStreams != 0) break;
        uVar12 = (ulong)((int)uVar12 + 1);
      }
    }
    *(int *)(puVar1 + 2) = (int)uVar12;
    if (((ulong)puVar1[3] & 0x10) != 0) {
      uVar16 = uVar16 + 1;
      uVar17 = (ulong)uVar16;
      uVar4 = p_Var3[uVar12].numUnpackStreams;
      if (uVar4 <= uVar17) {
        uVar16 = 0;
      }
      uVar12 = (ulong)((uint)(uVar4 <= uVar17) + (int)uVar12);
    }
  }
  uVar14 = (ulong)((int)uVar14 + 1);
  if (val->numFolders <= uVar14) {
    return 0;
  }
  goto LAB_00160a8d;
}

Assistant:

static int
read_Header(struct archive_read *a, struct _7z_header_info *h,
    int check_header_id)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7z_folder *folders;
	struct _7z_stream_info *si = &(zip->si);
	struct _7zip_entry *entries;
	uint32_t folderIndex, indexInFolder;
	unsigned i;
	int eindex, empty_streams, sindex;

	if (check_header_id) {
		/*
		 * Read Header.
		 */
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		if (*p != kHeader)
			return (-1);
	}

	/*
	 * Read ArchiveProperties.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kArchiveProperties) {
		for (;;) {
			uint64_t size;
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			if (*p == 0)
				break;
			if (parse_7zip_uint64(a, &size) < 0)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 * Read MainStreamsInfo.
	 */
	if (*p == kMainStreamsInfo) {
		if (read_StreamsInfo(a, &(zip->si)) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kEnd)
		return (0);

	/*
	 * Read FilesInfo.
	 */
	if (*p != kFilesInfo)
		return (-1);

	if (parse_7zip_uint64(a, &(zip->numFiles)) < 0)
		return (-1);
	if (1000000 < zip->numFiles)
			return (-1);

	zip->entries = calloc((size_t)zip->numFiles, sizeof(*zip->entries));
	if (zip->entries == NULL)
		return (-1);
	entries = zip->entries;

	empty_streams = 0;
	for (;;) {
		int type;
		uint64_t size;
		size_t ll;

		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
		if (type == kEnd)
			break;

		if (parse_7zip_uint64(a, &size) < 0)
			return (-1);
		if (zip->header_bytes_remaining < size)
			return (-1);
		ll = (size_t)size;

		switch (type) {
		case kEmptyStream:
			h->emptyStreamBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->emptyStreamBools));
			if (h->emptyStreamBools == NULL)
				return (-1);
			if (read_Bools(
			    a, h->emptyStreamBools, (size_t)zip->numFiles) < 0)
				return (-1);
			empty_streams = 0;
			for (i = 0; i < zip->numFiles; i++) {
				if (h->emptyStreamBools[i])
					empty_streams++;
			}
			break;
		case kEmptyFile:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			h->emptyFileBools = calloc(empty_streams,
			    sizeof(*h->emptyFileBools));
			if (h->emptyFileBools == NULL)
				return (-1);
			if (read_Bools(a, h->emptyFileBools, empty_streams) < 0)
				return (-1);
			break;
		case kAnti:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			h->antiBools = calloc(empty_streams,
			    sizeof(*h->antiBools));
			if (h->antiBools == NULL)
				return (-1);
			if (read_Bools(a, h->antiBools, empty_streams) < 0)
				return (-1);
			break;
		case kCTime:
		case kATime:
		case kMTime:
			if (read_Times(a, h, type) < 0)
				return (-1);
			break;
		case kName:
		{
			unsigned char *np;
			size_t nl, nb;

			/* Skip one byte. */
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			ll--;

			if ((ll & 1) || ll < zip->numFiles * 4)
				return (-1);

			zip->entry_names = malloc(ll);
			if (zip->entry_names == NULL)
				return (-1);
			np = zip->entry_names;
			nb = ll;
			/*
			 * Copy whole file names.
			 * NOTE: This loop prevents from expanding
			 * the uncompressed buffer in order not to
			 * use extra memory resource.
			 */
			while (nb) {
				size_t b;
				if (nb > UBUFF_SIZE)
					b = UBUFF_SIZE;
				else
					b = nb;
				if ((p = header_bytes(a, b)) == NULL)
					return (-1);
				memcpy(np, p, b);
				np += b;
				nb -= b;
			}
			np = zip->entry_names;
			nl = ll;

			for (i = 0; i < zip->numFiles; i++) {
				entries[i].utf16name = np;
#if defined(_WIN32) && !defined(__CYGWIN__) && defined(_DEBUG)
				entries[i].wname = (wchar_t *)np;
#endif

				/* Find a terminator. */
				while (nl >= 2 && (np[0] || np[1])) {
					np += 2;
					nl -= 2;
				}
				if (nl < 2)
					return (-1);/* Terminator not found */
				entries[i].name_len = np - entries[i].utf16name;
				np += 2;
				nl -= 2;
			}
			break;
		}
		case kAttributes:
		{
			int allAreDefined;

			if ((p = header_bytes(a, 2)) == NULL)
				return (-1);
			allAreDefined = *p;
			h->attrBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->attrBools));
			if (h->attrBools == NULL)
				return (-1);
			if (allAreDefined)
				memset(h->attrBools, 1, (size_t)zip->numFiles);
			else {
				if (read_Bools(a, h->attrBools,
				      (size_t)zip->numFiles) < 0)
					return (-1);
			}
			for (i = 0; i < zip->numFiles; i++) {
				if (h->attrBools[i]) {
					if ((p = header_bytes(a, 4)) == NULL)
						return (-1);
					entries[i].attr = archive_le32dec(p);
				}
			}
			break;
		}
		default:
			if (header_bytes(a, ll) == NULL)
				return (-1);
			break;
		}
	}

	/*
	 * Set up entry's attributes.
	 */
	folders = si->ci.folders;
	eindex = sindex = 0;
	folderIndex = indexInFolder = 0;
	for (i = 0; i < zip->numFiles; i++) {
		if (h->emptyStreamBools == NULL || h->emptyStreamBools[i] == 0)
			entries[i].flg |= HAS_STREAM;
		/* The high 16 bits of attributes is a posix file mode. */
		entries[i].mode = entries[i].attr >> 16;
		if (entries[i].flg & HAS_STREAM) {
			if ((size_t)sindex >= si->ss.unpack_streams)
				return (-1);
			if (entries[i].mode == 0)
				entries[i].mode = AE_IFREG | 0666;
			if (si->ss.digestsDefined[sindex])
				entries[i].flg |= CRC32_IS_SET;
			entries[i].ssIndex = sindex;
			sindex++;
		} else {
			int dir;
			if (h->emptyFileBools == NULL)
				dir = 1;
			else {
				if (h->emptyFileBools[eindex])
					dir = 0;
				else
					dir = 1;
				eindex++;
			}
			if (entries[i].mode == 0) {
				if (dir)
					entries[i].mode = AE_IFDIR | 0777;
				else
					entries[i].mode = AE_IFREG | 0666;
			} else if (dir &&
			    (entries[i].mode & AE_IFMT) != AE_IFDIR) {
				entries[i].mode &= ~AE_IFMT;
				entries[i].mode |= AE_IFDIR;
			}
			if ((entries[i].mode & AE_IFMT) == AE_IFDIR &&
			    entries[i].name_len >= 2 &&
			    (entries[i].utf16name[entries[i].name_len-2] != '/' ||
			     entries[i].utf16name[entries[i].name_len-1] != 0)) {
				entries[i].utf16name[entries[i].name_len] = '/';
				entries[i].utf16name[entries[i].name_len+1] = 0;
				entries[i].name_len += 2;
			}
			entries[i].ssIndex = -1;
		}
		if (entries[i].attr & 0x01)
			entries[i].mode &= ~0222;/* Read only. */

		if ((entries[i].flg & HAS_STREAM) == 0 && indexInFolder == 0) {
			/*
			 * The entry is an empty file or a directory file,
			 * those both have no contents.
			 */
			entries[i].folderIndex = -1;
			continue;
		}
		if (indexInFolder == 0) {
			for (;;) {
				if (folderIndex >= si->ci.numFolders)
					return (-1);
				if (folders[folderIndex].numUnpackStreams)
					break;
				folderIndex++;
			}
		}
		entries[i].folderIndex = folderIndex;
		if ((entries[i].flg & HAS_STREAM) == 0)
			continue;
		indexInFolder++;
		if (indexInFolder >= folders[folderIndex].numUnpackStreams) {
			folderIndex++;
			indexInFolder = 0;
		}
	}

	return (0);
}